

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O0

void __thiscall
enact::WhileExpr::WhileExpr
          (WhileExpr *this,unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *condition,
          unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *body,Token *keyword)

{
  Token *keyword_local;
  unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *body_local;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *condition_local;
  WhileExpr *this_local;
  
  Expr::Expr(&this->super_Expr);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__WhileExpr_0016a2f0;
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::unique_ptr
            (&this->condition,condition);
  std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::unique_ptr
            (&this->body,body);
  Token::Token(&this->keyword,keyword);
  return;
}

Assistant:

WhileExpr(std::unique_ptr<Expr> condition, std::unique_ptr<BlockExpr> body, Token keyword) :
                condition{std::move(condition)},
                body{std::move(body)},
                keyword{std::move(keyword)} {}